

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void Bt4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit;
  CLzRef CVar1;
  byte *cur;
  CLzRef *pCVar2;
  uint uVar3;
  UInt32 UVar4;
  uint uVar5;
  uint uVar6;
  
  do {
    lenLimit = p->lenLimit;
    if (lenLimit < 4) {
      MatchFinder_MovePos(p);
    }
    else {
      cur = p->buffer;
      uVar3 = (uint)cur[1] ^ p->crc[*cur];
      uVar5 = (uint)cur[2] << 8 ^ uVar3;
      pCVar2 = p->hash;
      uVar6 = ((p->crc[cur[3]] << 5 ^ uVar5) & p->hashMask) + 0x10400;
      UVar4 = pCVar2[uVar6];
      CVar1 = p->pos;
      pCVar2[uVar6] = CVar1;
      pCVar2[(ulong)(uVar5 & 0xffff) + 0x400] = CVar1;
      pCVar2[uVar3 & 0x3ff] = CVar1;
      SkipMatchesSpec(lenLimit,UVar4,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      if (UVar4 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Bt4_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2, h3;
    UInt32 *hash;
    SKIP_HEADER(4)
    HASH4_CALC;
    hash = p->hash;
    curMatch = hash[kFix4HashSize + hv];
    hash[                h2] =
    hash[kFix3HashSize + h3] =
    hash[kFix4HashSize + hv] = p->pos;
    SKIP_FOOTER
  }
  while (--num != 0);
}